

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O2

LJAtypeParameters * __thiscall
OpenMD::LennardJonesAdapter::getLJParam
          (LJAtypeParameters *__return_storage_ptr__,LennardJonesAdapter *this)

{
  pointer pcVar1;
  bool bVar2;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> ljData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_68;
  undefined1 local_58 [16];
  string local_48;
  
  bVar2 = isLennardJones(this);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n\tthat does not appear to be a Lennard-Jones atom.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n\tparameters for atomType %s.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,OpenMD::GenericData>
            (&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not convert\n\tGenericData to LJAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  *(size_type *)&__return_storage_ptr__->isSoft =
       local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].id_.
       _M_string_length;
  pcVar1 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
           id_._M_dataplus._M_p;
  __return_storage_ptr__->sigma =
       (RealType)
       local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
       _vptr_GenericData;
  __return_storage_ptr__->epsilon = (RealType)pcVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

LJAtypeParameters LennardJonesAdapter::getLJParam() {
    if (!isLennardJones()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Lennard-Jones atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(LJtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<LJAtypeData> ljData =
        std::dynamic_pointer_cast<LJAtypeData>(data);
    if (ljData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not convert\n"
               "\tGenericData to LJAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return ljData->getData();
  }